

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::buffer(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  uint dst;
  iterator iVar2;
  mapped_type *pmVar3;
  Cell u;
  char buffer [1024];
  
  requireDStackDepth(this,1,"BUFFER");
  requireDStackAvailable(this,1,"BUFFER");
  this_00 = &this->dStack;
  u = ForthStack<unsigned_int>::getTop(this_00);
  if (u != 0) {
    iVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>,_std::_Select1st<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
            ::find(&(this->blocksInProcess)._M_t,&u);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header) {
      memset(buffer,0x20,0x400);
      ForthStack<unsigned_int>::setTop(this_00,0x400);
      memAllocate(this);
      ForthStack<unsigned_int>::getTop(this_00);
      ForthStack<unsigned_int>::pop(this_00);
      dst = ForthStack<unsigned_int>::getTop(this_00);
      moveIntoDataSpace(this,dst,buffer,0x400);
      CVar1 = u;
      pmVar3 = std::
               map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
               ::operator[](&this->blocksInProcess,&u);
      pmVar3->blockNumber = CVar1;
      pmVar3->blockLocation = dst;
      *(undefined4 *)&pmVar3->blockModified = 0;
    }
    else {
      ForthStack<unsigned_int>::setTop(this_00,*(uint *)&iVar2._M_node[1]._M_parent);
    }
    this->blockCurrent = u;
  }
  return;
}

Assistant:

void buffer(){
			REQUIRE_DSTACK_DEPTH(1, "BUFFER");
			REQUIRE_DSTACK_AVAILABLE(1, "BUFFER");
			Cell u = dStack.getTop();
			if (u > 0) {
				auto foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					dStack.setTop((*foundIt).second.blockLocation);
				}
				else {
						char buffer[1024];
						std::memset(buffer, ' ', 1024);
						// get memory
						dStack.setTop(1024);
						memAllocate();
						auto ec = dStack.getTop(); pop();
						// copy to memory
						auto address = dStack.getTop();
						moveIntoDataSpace(address, buffer, 1024);
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
				}
				blockCurrent = u;
			}

		}